

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressBlock_btlazy2_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  uint uVar2;
  uint uVar3;
  seqDef *psVar4;
  int iVar5;
  bool bVar6;
  undefined8 uVar7;
  seqStore_t *psVar8;
  uint uVar9;
  uint uVar10;
  size_t sVar11;
  ulong uVar12;
  BYTE *pBVar13;
  U32 UVar14;
  int *mEnd;
  BYTE *pBVar15;
  int *piVar16;
  BYTE *pBVar17;
  int *piVar18;
  long lVar19;
  U32 UVar20;
  U32 UVar21;
  ulong uVar22;
  BYTE *pBVar23;
  uint uVar24;
  U32 UVar25;
  ulong uVar26;
  ulong uVar27;
  int *ip;
  int iVar28;
  int iVar29;
  size_t ofbCandidate;
  U32 maxDistance;
  size_t local_b0;
  int *local_a8;
  int *local_a0;
  int *local_98;
  U32 local_90;
  U32 local_8c;
  int local_88;
  uint local_84;
  ulong local_80;
  seqStore_t *local_78;
  BYTE *local_70;
  BYTE *local_68;
  BYTE *local_60;
  int *local_58;
  int *local_50;
  int *local_48;
  U32 *local_40;
  BYTE *local_38;
  
  piVar18 = (int *)((long)src + srcSize);
  local_58 = (int *)((long)src + (srcSize - 8));
  local_60 = (ms->window).base;
  pBVar23 = (ms->window).dictBase;
  uVar10 = (ms->window).dictLimit;
  uVar12 = (ulong)uVar10;
  local_68 = local_60 + uVar12;
  uVar2 = (ms->window).lowLimit;
  uVar3 = (ms->cParams).windowLog;
  uVar9 = (ms->cParams).minMatch;
  uVar24 = 6;
  if (uVar9 < 6) {
    uVar24 = uVar9;
  }
  uVar9 = 4;
  if (4 < uVar24) {
    uVar9 = uVar24;
  }
  UVar21 = *rep;
  local_90 = rep[1];
  ms->lazySkipping = 0;
  ip = (int *)((ulong)(local_68 == (BYTE *)src) + (long)src);
  local_98 = (int *)src;
  local_40 = rep;
  if (ip < local_58) {
    local_50 = (int *)(pBVar23 + uVar12);
    local_38 = pBVar23 + uVar2;
    local_84 = 1 << ((byte)uVar3 & 0x1f);
    local_88 = uVar10 - 1;
    local_48 = piVar18 + -8;
    local_a0 = piVar18;
    local_80 = uVar12;
    local_78 = seqStore;
    local_70 = pBVar23;
    do {
      iVar28 = (int)ip - (int)local_60;
      iVar29 = iVar28 + 1;
      UVar20 = (ms->window).lowLimit;
      UVar14 = iVar29 - local_84;
      if (iVar29 - UVar20 <= local_84) {
        UVar14 = UVar20;
      }
      if (ms->loadedDictEnd != 0) {
        UVar14 = UVar20;
      }
      uVar10 = iVar29 - UVar21;
      pBVar15 = local_60;
      if (uVar10 < (uint)uVar12) {
        pBVar15 = pBVar23;
      }
      local_a8 = (int *)((long)ip + 1);
      if (local_88 - uVar10 < 3) {
LAB_0016da1a:
        uVar27 = 0;
      }
      else {
        uVar27 = 0;
        if (UVar21 <= (iVar28 - UVar14) + 1) {
          if (*local_a8 != *(int *)(pBVar15 + uVar10)) goto LAB_0016da1a;
          piVar16 = piVar18;
          if (uVar10 < (uint)uVar12) {
            piVar16 = local_50;
          }
          sVar11 = ZSTD_count_2segments
                             ((BYTE *)((long)ip + 5),(BYTE *)((long)(pBVar15 + uVar10) + 4),
                              (BYTE *)piVar18,(BYTE *)piVar16,local_68);
          uVar27 = sVar11 + 4;
        }
      }
      local_b0 = 999999999;
      if (uVar9 == 6) {
        uVar12 = ZSTD_BtFindBestMatch_extDict_6(ms,(BYTE *)ip,(BYTE *)piVar18,&local_b0);
      }
      else if (uVar9 == 5) {
        uVar12 = ZSTD_BtFindBestMatch_extDict_5(ms,(BYTE *)ip,(BYTE *)piVar18,&local_b0);
      }
      else {
        uVar12 = ZSTD_BtFindBestMatch_extDict_4(ms,(BYTE *)ip,(BYTE *)piVar18,&local_b0);
      }
      uVar22 = uVar27;
      if (uVar27 < uVar12) {
        uVar22 = uVar12;
      }
      if (uVar22 < 4) {
        uVar12 = (long)ip - (long)local_98;
        ip = (int *)((long)ip + (uVar12 >> 8) + 1);
        ms->lazySkipping = (uint)(0x8ff < uVar12);
        uVar12 = local_80;
        pBVar23 = local_70;
        UVar14 = local_90;
      }
      else {
        piVar18 = ip;
        uVar26 = local_b0;
        if (uVar12 <= uVar27) {
          piVar18 = local_a8;
          uVar26 = 1;
        }
        local_a8 = piVar18;
        local_8c = UVar21;
        if (ip < local_58) {
          do {
            piVar18 = (int *)((long)ip + 1);
            iVar29 = iVar28 + 1;
            if (uVar26 == 0) {
              uVar26 = 0;
            }
            else {
              UVar20 = (ms->window).lowLimit;
              UVar14 = iVar29 - local_84;
              if (iVar29 - UVar20 <= local_84) {
                UVar14 = UVar20;
              }
              if (ms->loadedDictEnd != 0) {
                UVar14 = UVar20;
              }
              uVar10 = iVar29 - UVar21;
              pBVar23 = local_60;
              if (uVar10 < (uint)local_80) {
                pBVar23 = local_70;
              }
              if (((2 < local_88 - uVar10) && (UVar21 <= iVar29 - UVar14)) &&
                 (*piVar18 == *(int *)(pBVar23 + uVar10))) {
                piVar16 = local_a0;
                if (uVar10 < (uint)local_80) {
                  piVar16 = local_50;
                }
                sVar11 = ZSTD_count_2segments
                                   ((BYTE *)((long)ip + 5),(BYTE *)((long)(pBVar23 + uVar10) + 4),
                                    (BYTE *)local_a0,(BYTE *)piVar16,local_68);
                if (sVar11 < 0xfffffffffffffffc) {
                  uVar10 = 0x1f;
                  if ((uint)uVar26 != 0) {
                    for (; (uint)uVar26 >> uVar10 == 0; uVar10 = uVar10 - 1) {
                    }
                  }
                  if ((int)((uVar10 ^ 0x1f) + (int)uVar22 * 3 + -0x1e) < (int)(sVar11 + 4) * 3) {
                    uVar26 = 1;
                    uVar22 = sVar11 + 4;
                    local_a8 = piVar18;
                  }
                }
              }
            }
            local_b0 = 999999999;
            if (uVar9 == 6) {
              uVar12 = ZSTD_BtFindBestMatch_extDict_6(ms,(BYTE *)piVar18,(BYTE *)local_a0,&local_b0)
              ;
            }
            else if (uVar9 == 5) {
              uVar12 = ZSTD_BtFindBestMatch_extDict_5(ms,(BYTE *)piVar18,(BYTE *)local_a0,&local_b0)
              ;
            }
            else {
              uVar12 = ZSTD_BtFindBestMatch_extDict_4(ms,(BYTE *)piVar18,(BYTE *)local_a0,&local_b0)
              ;
            }
            piVar16 = local_a0;
            bVar6 = true;
            if (3 < uVar12) {
              uVar10 = 0x1f;
              if ((uint)uVar26 != 0) {
                for (; (uint)uVar26 >> uVar10 == 0; uVar10 = uVar10 - 1) {
                }
              }
              iVar5 = 0x1f;
              if ((uint)local_b0 != 0) {
                for (; (uint)local_b0 >> iVar5 == 0; iVar5 = iVar5 + -1) {
                }
              }
              if ((int)((uVar10 ^ 0x1f) + (int)uVar22 * 4 + -0x1b) < (int)uVar12 * 4 - iVar5) {
                bVar6 = false;
                uVar22 = uVar12;
                uVar26 = local_b0;
                local_a8 = piVar18;
              }
            }
            UVar21 = local_8c;
            if (bVar6) {
              if (local_58 <= piVar18) break;
              piVar18 = (int *)((long)ip + 2);
              iVar29 = iVar28 + 2;
              if (uVar26 == 0) {
                uVar26 = 0;
              }
              else {
                UVar21 = (ms->window).lowLimit;
                UVar20 = iVar29 - local_84;
                if (iVar29 - UVar21 <= local_84) {
                  UVar20 = UVar21;
                }
                if (ms->loadedDictEnd != 0) {
                  UVar20 = UVar21;
                }
                uVar10 = iVar29 - local_8c;
                pBVar23 = local_60;
                if (uVar10 < (uint)local_80) {
                  pBVar23 = local_70;
                }
                if (((2 < local_88 - uVar10) && (local_8c <= iVar29 - UVar20)) &&
                   (*piVar18 == *(int *)(pBVar23 + uVar10))) {
                  mEnd = local_a0;
                  if (uVar10 < (uint)local_80) {
                    mEnd = local_50;
                  }
                  sVar11 = ZSTD_count_2segments
                                     ((BYTE *)((long)ip + 6),(BYTE *)((long)(pBVar23 + uVar10) + 4),
                                      (BYTE *)local_a0,(BYTE *)mEnd,local_68);
                  if (sVar11 < 0xfffffffffffffffc) {
                    uVar10 = 0x1f;
                    if ((uint)uVar26 != 0) {
                      for (; (uint)uVar26 >> uVar10 == 0; uVar10 = uVar10 - 1) {
                      }
                    }
                    if ((int)((uVar10 ^ 0x1f) + (int)uVar22 * 4 + -0x1e) < (int)(sVar11 + 4) * 4) {
                      uVar26 = 1;
                      uVar22 = sVar11 + 4;
                      local_a8 = piVar18;
                    }
                  }
                }
              }
              UVar21 = local_8c;
              local_b0 = 999999999;
              if (uVar9 == 6) {
                uVar12 = ZSTD_BtFindBestMatch_extDict_6
                                   (ms,(BYTE *)piVar18,(BYTE *)piVar16,&local_b0);
              }
              else if (uVar9 == 5) {
                uVar12 = ZSTD_BtFindBestMatch_extDict_5
                                   (ms,(BYTE *)piVar18,(BYTE *)piVar16,&local_b0);
              }
              else {
                uVar12 = ZSTD_BtFindBestMatch_extDict_4
                                   (ms,(BYTE *)piVar18,(BYTE *)piVar16,&local_b0);
              }
              bVar6 = true;
              if (3 < uVar12) {
                uVar10 = 0x1f;
                if ((uint)uVar26 != 0) {
                  for (; (uint)uVar26 >> uVar10 == 0; uVar10 = uVar10 - 1) {
                  }
                }
                iVar28 = 0x1f;
                if ((uint)local_b0 != 0) {
                  for (; (uint)local_b0 >> iVar28 == 0; iVar28 = iVar28 + -1) {
                  }
                }
                if ((int)((uVar10 ^ 0x1f) + (int)uVar22 * 4 + -0x18) < (int)uVar12 * 4 - iVar28) {
                  bVar6 = false;
                  uVar22 = uVar12;
                  uVar26 = local_b0;
                  local_a8 = piVar18;
                }
              }
              if (bVar6) break;
            }
            iVar28 = iVar29;
            ip = piVar18;
          } while (piVar18 < local_58);
        }
        pBVar23 = local_70;
        UVar20 = UVar21;
        UVar14 = local_90;
        if (3 < uVar26) {
          pBVar17 = (BYTE *)((long)local_a8 + (3 - (long)(local_60 + uVar26)));
          pBVar13 = local_68;
          pBVar15 = local_60;
          if ((uint)pBVar17 < (uint)local_80) {
            pBVar13 = local_38;
            pBVar15 = local_70;
          }
          if ((local_98 < local_a8) &&
             (uVar12 = (ulong)pBVar17 & 0xffffffff, pBVar13 < pBVar15 + uVar12)) {
            pBVar15 = pBVar15 + uVar12;
            do {
              piVar18 = (int *)((long)local_a8 + -1);
              pBVar15 = pBVar15 + -1;
              if ((*(BYTE *)piVar18 != *pBVar15) ||
                 (uVar22 = uVar22 + 1, local_a8 = piVar18, piVar18 <= local_98)) break;
            } while (pBVar13 < pBVar15);
          }
          UVar20 = (U32)uVar26 - 3;
          UVar14 = UVar21;
        }
        if (local_78->maxNbSeq <=
            (ulong)((long)local_78->sequences - (long)local_78->sequencesStart >> 3)) {
LAB_0016e273:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < local_78->maxNbLit) {
LAB_0016e2d0:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar12 = (long)local_a8 - (long)local_98;
        pBVar15 = local_78->lit;
        if (local_78->litStart + local_78->maxNbLit < pBVar15 + uVar12) {
LAB_0016e2ef:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468e,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_a0 < local_a8) {
LAB_0016e2b1:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_48 < local_a8) {
          ZSTD_safecopyLiterals(pBVar15,(BYTE *)local_98,(BYTE *)local_a8,(BYTE *)local_48);
        }
        else {
          uVar7 = *(undefined8 *)(local_98 + 2);
          *(undefined8 *)pBVar15 = *(undefined8 *)local_98;
          *(undefined8 *)(pBVar15 + 8) = uVar7;
          if (0x10 < uVar12) {
            pBVar15 = local_78->lit;
            if ((BYTE *)0xffffffffffffffe0 < pBVar15 + 0x10 + (-0x10 - (long)(local_98 + 4))) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x36a6,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar7 = *(undefined8 *)(local_98 + 6);
            *(undefined8 *)(pBVar15 + 0x10) = *(undefined8 *)(local_98 + 4);
            *(undefined8 *)(pBVar15 + 0x18) = uVar7;
            if (0x20 < (long)uVar12) {
              lVar19 = 0;
              do {
                puVar1 = (undefined8 *)((long)local_98 + lVar19 + 0x20);
                uVar7 = puVar1[1];
                pBVar13 = pBVar15 + lVar19 + 0x20;
                *(undefined8 *)pBVar13 = *puVar1;
                *(undefined8 *)(pBVar13 + 8) = uVar7;
                puVar1 = (undefined8 *)((long)local_98 + lVar19 + 0x30);
                uVar7 = puVar1[1];
                *(undefined8 *)(pBVar13 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar13 + 0x18) = uVar7;
                lVar19 = lVar19 + 0x20;
              } while (pBVar13 + 0x20 < pBVar15 + uVar12);
            }
          }
        }
        psVar8 = local_78;
        piVar18 = local_a0;
        local_78->lit = local_78->lit + uVar12;
        if (0xffff < uVar12) {
          if (local_78->longLengthType != ZSTD_llt_none) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46a0,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_78->longLengthType = ZSTD_llt_literalLength;
          local_78->longLengthPos =
               (U32)((ulong)((long)local_78->sequences - (long)local_78->sequencesStart) >> 3);
        }
        psVar4 = local_78->sequences;
        psVar4->litLength = (U16)uVar12;
        psVar4->offBase = (U32)uVar26;
        if (uVar22 < 3) {
LAB_0016e292:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46aa,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0xffff < uVar22 - 3) {
          if (local_78->longLengthType != ZSTD_llt_none) {
LAB_0016e30e:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46ad,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_78->longLengthType = ZSTD_llt_matchLength;
          local_78->longLengthPos =
               (U32)((ulong)((long)psVar4 - (long)local_78->sequencesStart) >> 3);
        }
        psVar4->mlBase = (U16)(uVar22 - 3);
        local_78->sequences = psVar4 + 1;
        if (ms->lazySkipping != 0) {
          ms->lazySkipping = 0;
        }
        ip = (int *)((long)local_a8 + uVar22);
        uVar12 = local_80;
        local_98 = ip;
        do {
          UVar21 = UVar20;
          if (local_58 < ip) break;
          iVar29 = (int)ip - (int)local_60;
          UVar21 = (ms->window).lowLimit;
          UVar25 = iVar29 - local_84;
          if (iVar29 - UVar21 <= local_84) {
            UVar25 = UVar21;
          }
          if (ms->loadedDictEnd != 0) {
            UVar25 = UVar21;
          }
          uVar10 = iVar29 - UVar14;
          pBVar15 = local_60;
          if (uVar10 < (uint)uVar12) {
            pBVar15 = pBVar23;
          }
          if (((local_88 - uVar10 < 3) || (iVar29 - UVar25 < UVar14)) ||
             (*ip != *(int *)(pBVar15 + uVar10))) {
            bVar6 = false;
            UVar21 = UVar14;
          }
          else {
            piVar16 = piVar18;
            if (uVar10 < (uint)uVar12) {
              piVar16 = local_50;
            }
            sVar11 = ZSTD_count_2segments
                               ((BYTE *)(ip + 1),(BYTE *)((long)(pBVar15 + uVar10) + 4),
                                (BYTE *)piVar18,(BYTE *)piVar16,local_68);
            if (psVar8->maxNbSeq <=
                (ulong)((long)psVar8->sequences - (long)psVar8->sequencesStart >> 3))
            goto LAB_0016e273;
            if (0x20000 < psVar8->maxNbLit) goto LAB_0016e2d0;
            pBVar23 = psVar8->lit;
            if (psVar8->litStart + psVar8->maxNbLit < pBVar23) goto LAB_0016e2ef;
            if (piVar18 < local_98) goto LAB_0016e2b1;
            if (local_48 < local_98) {
              ZSTD_safecopyLiterals(pBVar23,(BYTE *)local_98,(BYTE *)local_98,(BYTE *)local_48);
            }
            else {
              uVar7 = *(undefined8 *)(local_98 + 2);
              *(undefined8 *)pBVar23 = *(undefined8 *)local_98;
              *(undefined8 *)(pBVar23 + 8) = uVar7;
            }
            psVar4 = psVar8->sequences;
            psVar4->litLength = 0;
            psVar4->offBase = 1;
            if (sVar11 + 4 < 3) goto LAB_0016e292;
            if (0xffff < sVar11 + 1) {
              if (psVar8->longLengthType != ZSTD_llt_none) goto LAB_0016e30e;
              psVar8->longLengthType = ZSTD_llt_matchLength;
              psVar8->longLengthPos =
                   (U32)((ulong)((long)psVar4 - (long)psVar8->sequencesStart) >> 3);
            }
            psVar4->mlBase = (U16)(sVar11 + 1);
            psVar8->sequences = psVar4 + 1;
            ip = (int *)((long)ip + sVar11 + 4);
            bVar6 = true;
            uVar12 = local_80;
            pBVar23 = local_70;
            UVar21 = UVar20;
            UVar20 = UVar14;
            local_98 = ip;
          }
          UVar14 = UVar21;
          UVar21 = UVar20;
        } while (bVar6);
      }
      local_90 = UVar14;
    } while (ip < local_58);
  }
  *local_40 = UVar21;
  local_40[1] = local_90;
  return (long)piVar18 - (long)local_98;
}

Assistant:

size_t ZSTD_compressBlock_btlazy2_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_binaryTree, 2);
}